

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O3

void __thiscall
deqp::gls::VarSpec::set<4,4>
          (VarSpec *this,Matrix<float,_4,_4> *minValue_,Matrix<float,_4,_4> *maxValue_)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  DataType DVar3;
  long lVar4;
  Array<float,_16> data;
  undefined8 local_58 [8];
  
  DVar3 = glu::getDataTypeMatrix(4,4);
  this->type = DVar3;
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)((long)(minValue_->m_data).m_data[0].m_data + lVar4);
    uVar2 = puVar1[1];
    *(undefined8 *)((long)local_58 + lVar4) = *puVar1;
    *(undefined8 *)((long)local_58 + lVar4 + 8) = uVar2;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x40);
  *(undefined8 *)((long)&this->minValue + 0x30) = local_58[6];
  *(undefined8 *)((long)&this->minValue + 0x38) = local_58[7];
  *(undefined8 *)((long)&this->minValue + 0x20) = local_58[4];
  *(undefined8 *)((long)&this->minValue + 0x28) = local_58[5];
  *(undefined8 *)((long)&this->minValue + 0x10) = local_58[2];
  *(undefined8 *)((long)&this->minValue + 0x18) = local_58[3];
  *(undefined8 *)&this->minValue = local_58[0];
  *(undefined8 *)((long)&this->minValue + 8) = local_58[1];
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)((long)(maxValue_->m_data).m_data[0].m_data + lVar4);
    uVar2 = puVar1[1];
    *(undefined8 *)((long)local_58 + lVar4) = *puVar1;
    *(undefined8 *)((long)local_58 + lVar4 + 8) = uVar2;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x40);
  *(undefined8 *)((long)&this->maxValue + 0x30) = local_58[6];
  *(undefined8 *)((long)&this->maxValue + 0x38) = local_58[7];
  *(undefined8 *)((long)&this->maxValue + 0x20) = local_58[4];
  *(undefined8 *)((long)&this->maxValue + 0x28) = local_58[5];
  *(undefined8 *)((long)&this->maxValue + 0x10) = local_58[2];
  *(undefined8 *)((long)&this->maxValue + 0x18) = local_58[3];
  *(undefined8 *)&this->maxValue = local_58[0];
  *(undefined8 *)((long)&this->maxValue + 8) = local_58[1];
  return;
}

Assistant:

void set (const tcu::Matrix<float, ValRows, ValCols>& minValue_, const tcu::Matrix<float, ValRows, ValCols>& maxValue_)
	{
		type = glu::getDataTypeMatrix(ValCols, ValRows);
		matToArr(minValue_, minValue.f);
		matToArr(maxValue_, maxValue.f);
	}